

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureCommand.cxx
# Opt level: O3

cmCTestGenericHandler * __thiscall
cmCTestConfigureCommand::InitializeHandler(cmCTestConfigureCommand *this)

{
  cmCTest *pcVar1;
  cmMakefile *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  cmValue cVar7;
  cmCTestGenericHandler *pcVar8;
  cmake *gname;
  ostream *poVar9;
  string *psVar10;
  char *pcVar11;
  char *pcVar12;
  string *psVar13;
  string *option;
  pointer pbVar14;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string cmakeConfigureCommand;
  string cmakelists_file;
  cmList options;
  ostringstream e;
  string local_2b0;
  undefined1 local_290 [16];
  undefined1 local_280 [24];
  undefined1 local_268 [32];
  string local_248;
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  undefined1 local_208 [32];
  string *local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  pointer local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Any_data local_1a8 [3];
  ios_base local_170 [264];
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  local_208._0_8_ = (pointer)0x0;
  local_208._8_8_ = (pointer)0x0;
  local_208._16_8_ = (pointer)0x0;
  if ((this->Options)._M_string_length != 0) {
    cmList::Insert((container_type *)local_208,(const_iterator)0x0,&this->Options,Yes,No);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_280._0_8_ = local_280 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_290 + 0x10),"BuildDirectory","");
  cmCTest::GetCTestConfiguration((string *)&local_1e0,pcVar1,(string *)(local_290 + 0x10));
  uVar3 = local_1e0._8_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_allocated_capacity != &local_1d0) {
    operator_delete((void *)local_1e0._M_allocated_capacity,local_1d0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
    operator_delete((void *)local_280._0_8_,(ulong)(local_280._16_8_ + 1));
  }
  local_1e0._M_allocated_capacity = (size_type)&local_1d0;
  if ((undefined1 *)uVar3 == (undefined1 *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e0,
               "Build directory not specified. Either use BUILD argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY variable"
               ,"");
    cmCommand::SetError((cmCommand *)this,(string *)&local_1e0);
LAB_002da04c:
    local_218._M_allocated_capacity = local_1d0._M_allocated_capacity;
    local_228._0_8_ = local_1e0._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_allocated_capacity != &local_1d0) {
LAB_002da061:
      operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e0,"CTEST_CONFIGURE_COMMAND","");
    cVar7 = cmMakefile::GetDefinition(pcVar2,(string *)&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_allocated_capacity != &local_1d0) {
      operator_delete((void *)local_1e0._M_allocated_capacity,local_1d0._M_allocated_capacity + 1);
    }
    if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"ConfigureCommand",
                 cVar7.Value,(this->super_cmCTestHandlerCommand).Quiet);
LAB_002d9dea:
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      local_1e0._M_allocated_capacity = (size_type)&local_1d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e0,"CTEST_LABELS_FOR_SUBPROJECTS","");
      cVar7 = cmMakefile::GetDefinition(pcVar2,(string *)&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_allocated_capacity != &local_1d0) {
        operator_delete((void *)local_1e0._M_allocated_capacity,local_1d0._M_allocated_capacity + 1)
        ;
      }
      if (cVar7.Value != (string *)0x0) {
        cmCTest::SetCTestConfiguration
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
                   "LabelsForSubprojects",cVar7.Value,(this->super_cmCTestHandlerCommand).Quiet);
      }
      pcVar8 = &cmCTest::GetConfigureHandler
                          ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest)->
                super_cmCTestGenericHandler;
      (*((cmCTestGenericHandler *)&pcVar8->_vptr_cmCTestGenericHandler)->_vptr_cmCTestGenericHandler
        [3])(pcVar8);
      pcVar8->Quiet = (this->super_cmCTestHandlerCommand).Quiet;
      goto LAB_002da06c;
    }
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_1e0._M_allocated_capacity = (size_type)&local_1d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"CTEST_CMAKE_GENERATOR","")
    ;
    cVar7 = cmMakefile::GetDefinition(pcVar2,(string *)&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_allocated_capacity != &local_1d0) {
      operator_delete((void *)local_1e0._M_allocated_capacity,local_1d0._M_allocated_capacity + 1);
    }
    if ((cVar7.Value == (string *)0x0) || ((cVar7.Value)->_M_string_length == 0)) {
      local_1e0._M_allocated_capacity = (size_type)&local_1d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e0,
                 "Configure command is not specified. If this is a \"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, set CTEST_CONFIGURE_COMMAND."
                 ,"");
      cmCommand::SetError((cmCommand *)this,(string *)&local_1e0);
      goto LAB_002da04c;
    }
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    local_1e0._M_allocated_capacity = (size_type)&local_1d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"SourceDirectory","");
    cmCTest::GetCTestConfiguration((string *)local_228,pcVar1,(string *)&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_allocated_capacity != &local_1d0) {
      operator_delete((void *)local_1e0._M_allocated_capacity,local_1d0._M_allocated_capacity + 1);
    }
    if (local_228._8_8_ == 0) {
      local_1e0._M_allocated_capacity = (size_type)&local_1d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e0,
                 "Source directory not specified. Either use SOURCE argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY variable"
                 ,"");
      cmCommand::SetError((cmCommand *)this,(string *)&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_allocated_capacity != &local_1d0) {
        operator_delete((void *)local_1e0._M_allocated_capacity,local_1d0._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._0_8_ != &local_218) goto LAB_002da061;
    }
    else {
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_248,local_228._0_8_,(char *)(local_228._0_8_ + local_228._8_8_));
      std::__cxx11::string::append((char *)&local_248);
      bVar4 = cmsys::SystemTools::FileExists(&local_248);
      if (bVar4) {
        gname = cmMakefile::GetCMakeInstance
                          ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                           Makefile);
        cmake::CreateGlobalGenerator((cmake *)local_290,(string *)gname,SUB81(cVar7.Value,0));
        if ((pointer)local_290._0_8_ == (pointer)0x0) {
          uVar6 = 0;
        }
        else {
          uVar6 = (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                               *)local_290._0_8_)->
                            super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                            )._M_t.
                            super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                            .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl
                            [0x28]._vptr_cmGlobalGeneratorFactory)();
          uVar3 = local_290._0_8_;
          local_290._0_8_ = (pointer)0x0;
          if ((pointer)uVar3 != (pointer)0x0) {
            (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                         *)uVar3)->
                      super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                      )._M_t.
                      super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                      .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                      _vptr_cmGlobalGeneratorFactory)();
          }
        }
        psVar10 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        local_280._16_8_ = local_280 + 0x18;
        local_280._0_8_ = (pointer)0x0;
        local_280._8_8_ = (pointer)0x1;
        local_268[0] = 0x22;
        local_1e0._M_allocated_capacity = 1;
        local_1d0._M_allocated_capacity = 0;
        local_1c0 = (psVar10->_M_dataplus)._M_p;
        local_1d0._8_8_ = psVar10->_M_string_length;
        local_1b8._M_allocated_capacity = 0;
        local_1a8[0]._0_8_ = local_50;
        local_68 = 0;
        local_60 = 1;
        local_50[0] = 0x22;
        local_1b8._8_8_ = 1;
        local_1a8[0]._8_8_ = 0;
        views._M_len = 3;
        views._M_array = (iterator)&local_1e0;
        local_1e0._8_8_ = local_280._16_8_;
        local_58 = (undefined1 *)local_1a8[0]._0_8_;
        cmCatViews(&local_2b0,views);
        uVar3 = local_208._8_8_;
        bVar5 = false;
        local_290._12_4_ = uVar6;
        local_1e8 = cVar7.Value;
        if (local_208._0_8_ != local_208._8_8_) {
          pbVar14 = (pointer)local_208._0_8_;
          bVar5 = false;
          do {
            std::__cxx11::string::append((char *)&local_2b0);
            std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)(pbVar14->_M_dataplus)._M_p);
            std::__cxx11::string::append((char *)&local_2b0);
            pcVar12 = (pbVar14->_M_dataplus)._M_p;
            pcVar11 = strstr(pcVar12,"CMAKE_BUILD_TYPE=");
            if ((pcVar11 != (char *)0x0) ||
               (pcVar12 = strstr(pcVar12,"CMAKE_BUILD_TYPE:STRING="), pcVar12 != (char *)0x0)) {
              bVar5 = true;
            }
            pbVar14 = pbVar14 + 1;
          } while (pbVar14 != (pointer)uVar3);
        }
        psVar10 = local_1e8;
        if (((local_290._12_4_ & 1) == 0 && !bVar5) &&
           (psVar13 = cmCTest::GetConfigType_abi_cxx11_
                                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest),
           psVar13->_M_string_length != 0)) {
          std::__cxx11::string::append((char *)&local_2b0);
          psVar13 = cmCTest::GetConfigType_abi_cxx11_
                              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
          std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)(psVar13->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&local_2b0);
        }
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        local_1e0._M_allocated_capacity = (size_type)&local_1d0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e0,"CTEST_USE_LAUNCHERS","");
        bVar5 = cmMakefile::IsOn(pcVar2,(string *)&local_1e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_allocated_capacity != &local_1d0) {
          operator_delete((void *)local_1e0._M_allocated_capacity,
                          local_1d0._M_allocated_capacity + 1);
        }
        if (bVar5) {
          std::__cxx11::string::append((char *)&local_2b0);
        }
        std::__cxx11::string::append((char *)&local_2b0);
        std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)(psVar10->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_2b0);
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        local_1e0._M_allocated_capacity = (size_type)&local_1d0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e0,"CTEST_CMAKE_GENERATOR_PLATFORM","");
        cVar7 = cmMakefile::GetDefinition(pcVar2,(string *)&local_1e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_allocated_capacity != &local_1d0) {
          operator_delete((void *)local_1e0._M_allocated_capacity,
                          local_1d0._M_allocated_capacity + 1);
        }
        if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
          std::__cxx11::string::append((char *)&local_2b0);
          std::__cxx11::string::_M_append
                    ((char *)&local_2b0,(ulong)((cVar7.Value)->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&local_2b0);
        }
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        local_1e0._M_allocated_capacity = (size_type)&local_1d0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e0,"CTEST_CMAKE_GENERATOR_TOOLSET","");
        cVar7 = cmMakefile::GetDefinition(pcVar2,(string *)&local_1e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_allocated_capacity != &local_1d0) {
          operator_delete((void *)local_1e0._M_allocated_capacity,
                          local_1d0._M_allocated_capacity + 1);
        }
        if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
          std::__cxx11::string::append((char *)&local_2b0);
          std::__cxx11::string::_M_append
                    ((char *)&local_2b0,(ulong)((cVar7.Value)->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&local_2b0);
        }
        std::__cxx11::string::append((char *)&local_2b0);
        std::__cxx11::string::_M_append((char *)&local_2b0,local_228._0_8_);
        std::__cxx11::string::append((char *)&local_2b0);
        std::__cxx11::string::append((char *)&local_2b0);
        pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
        local_280._0_8_ = local_280 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_290 + 0x10),"BuildDirectory","");
        cmCTest::GetCTestConfiguration((string *)&local_1e0,pcVar1,(string *)(local_290 + 0x10));
        std::__cxx11::string::_M_append((char *)&local_2b0,local_1e0._M_allocated_capacity);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_allocated_capacity != &local_1d0) {
          operator_delete((void *)local_1e0._M_allocated_capacity,
                          local_1d0._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
          operator_delete((void *)local_280._0_8_,(ulong)(local_280._16_8_ + 1));
        }
        std::__cxx11::string::append((char *)&local_2b0);
        cmCTest::SetCTestConfiguration
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"ConfigureCommand"
                   ,&local_2b0,(this->super_cmCTestHandlerCommand).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_290._0_8_ != (pointer)0x0) {
          (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                       *)local_290._0_8_)->
                    super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                    )._M_t.
                    super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                    .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                    _vptr_cmGlobalGeneratorFactory)();
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0._M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1e0,"CMakeLists.txt file does not exist [",0x24);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1e0,local_248._M_dataplus._M_p,
                            local_248._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]",1);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError((cmCommand *)this,(string *)(local_290 + 0x10));
        if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
          operator_delete((void *)local_280._0_8_,(ulong)(local_280._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0._M_local_buf);
        std::ios_base::~ios_base(local_170);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._0_8_ != &local_218) {
        operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
      }
      if (bVar4) goto LAB_002d9dea;
    }
  }
  pcVar8 = (cmCTestGenericHandler *)0x0;
LAB_002da06c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_208);
  return pcVar8;
}

Assistant:

cmCTestGenericHandler* cmCTestConfigureCommand::InitializeHandler()
{
  cmList options;

  if (!this->Options.empty()) {
    options.assign(this->Options);
  }

  if (this->CTest->GetCTestConfiguration("BuildDirectory").empty()) {
    this->SetError(
      "Build directory not specified. Either use BUILD "
      "argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY "
      "variable");
    return nullptr;
  }

  cmValue ctestConfigureCommand =
    this->Makefile->GetDefinition("CTEST_CONFIGURE_COMMAND");

  if (cmNonempty(ctestConfigureCommand)) {
    this->CTest->SetCTestConfiguration("ConfigureCommand",
                                       *ctestConfigureCommand, this->Quiet);
  } else {
    cmValue cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");
    if (cmNonempty(cmakeGeneratorName)) {
      const std::string& source_dir =
        this->CTest->GetCTestConfiguration("SourceDirectory");
      if (source_dir.empty()) {
        this->SetError(
          "Source directory not specified. Either use SOURCE "
          "argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY "
          "variable");
        return nullptr;
      }

      const std::string cmakelists_file = source_dir + "/CMakeLists.txt";
      if (!cmSystemTools::FileExists(cmakelists_file)) {
        std::ostringstream e;
        e << "CMakeLists.txt file does not exist [" << cmakelists_file << "]";
        this->SetError(e.str());
        return nullptr;
      }

      bool multiConfig = false;
      bool cmakeBuildTypeInOptions = false;

      auto gg = this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
        *cmakeGeneratorName);
      if (gg) {
        multiConfig = gg->IsMultiConfig();
        gg.reset();
      }

      std::string cmakeConfigureCommand =
        cmStrCat('"', cmSystemTools::GetCMakeCommand(), '"');

      for (std::string const& option : options) {
        cmakeConfigureCommand += " \"";
        cmakeConfigureCommand += option;
        cmakeConfigureCommand += "\"";

        if ((nullptr != strstr(option.c_str(), "CMAKE_BUILD_TYPE=")) ||
            (nullptr != strstr(option.c_str(), "CMAKE_BUILD_TYPE:STRING="))) {
          cmakeBuildTypeInOptions = true;
        }
      }

      if (!multiConfig && !cmakeBuildTypeInOptions &&
          !this->CTest->GetConfigType().empty()) {
        cmakeConfigureCommand += " \"-DCMAKE_BUILD_TYPE:STRING=";
        cmakeConfigureCommand += this->CTest->GetConfigType();
        cmakeConfigureCommand += "\"";
      }

      if (this->Makefile->IsOn("CTEST_USE_LAUNCHERS")) {
        cmakeConfigureCommand += " \"-DCTEST_USE_LAUNCHERS:BOOL=TRUE\"";
      }

      cmakeConfigureCommand += " \"-G";
      cmakeConfigureCommand += *cmakeGeneratorName;
      cmakeConfigureCommand += "\"";

      cmValue cmakeGeneratorPlatform =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_PLATFORM");
      if (cmNonempty(cmakeGeneratorPlatform)) {
        cmakeConfigureCommand += " \"-A";
        cmakeConfigureCommand += *cmakeGeneratorPlatform;
        cmakeConfigureCommand += "\"";
      }

      cmValue cmakeGeneratorToolset =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_TOOLSET");
      if (cmNonempty(cmakeGeneratorToolset)) {
        cmakeConfigureCommand += " \"-T";
        cmakeConfigureCommand += *cmakeGeneratorToolset;
        cmakeConfigureCommand += "\"";
      }

      cmakeConfigureCommand += " \"-S";
      cmakeConfigureCommand += source_dir;
      cmakeConfigureCommand += "\"";

      cmakeConfigureCommand += " \"-B";
      cmakeConfigureCommand +=
        this->CTest->GetCTestConfiguration("BuildDirectory");
      cmakeConfigureCommand += "\"";

      this->CTest->SetCTestConfiguration("ConfigureCommand",
                                         cmakeConfigureCommand, this->Quiet);
    } else {
      this->SetError(
        "Configure command is not specified. If this is a "
        "\"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, "
        "set CTEST_CONFIGURE_COMMAND.");
      return nullptr;
    }
  }

  if (cmValue labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       *labelsForSubprojects, this->Quiet);
  }

  cmCTestConfigureHandler* handler = this->CTest->GetConfigureHandler();
  handler->Initialize();
  handler->SetQuiet(this->Quiet);
  return handler;
}